

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

void __thiscall
capnp::BufferedMessageStream::BufferedMessageStream
          (BufferedMessageStream *this,AsyncCapabilityStream *stream,
          IsShortLivedCallback *isShortLivedCallback,size_t bufferSizeInWords)

{
  Iface *pIVar1;
  word *pwVar2;
  
  (this->super_MessageStream)._vptr_MessageStream = (_func_int **)&PTR_tryReadMessage_006cb540;
  this->stream = &stream->super_AsyncIoStream;
  (this->capStream).ptr = stream;
  pIVar1 = (isShortLivedCallback->impl).ptr;
  (this->isShortLivedCallback).impl.disposer = (isShortLivedCallback->impl).disposer;
  (this->isShortLivedCallback).impl.ptr = pIVar1;
  (isShortLivedCallback->impl).ptr = (Iface *)0x0;
  pwVar2 = (word *)kj::_::HeapArrayDisposer::allocateImpl
                             (8,bufferSizeInWords,bufferSizeInWords,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  (this->buffer).ptr = pwVar2;
  (this->buffer).size_ = bufferSizeInWords;
  (this->buffer).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  this->beginData = pwVar2;
  this->beginAvailable = (byte *)pwVar2;
  (this->leftoverFds).builder.ptr = (OwnFd *)0x0;
  (this->leftoverFds).builder.pos = (RemoveConst<kj::OwnFd> *)0x0;
  (this->leftoverFds).builder.endPtr = (OwnFd *)0x0;
  (this->leftoverFds).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  this->hasOutstandingShortLivedMessage = false;
  return;
}

Assistant:

BufferedMessageStream::BufferedMessageStream(
    kj::AsyncCapabilityStream& stream, IsShortLivedCallback isShortLivedCallback,
    size_t bufferSizeInWords)
    : stream(stream), capStream(stream), isShortLivedCallback(kj::mv(isShortLivedCallback)),
      buffer(kj::heapArray<word>(bufferSizeInWords)),
      beginData(buffer.begin()), beginAvailable(buffer.asBytes().begin()) {}